

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void luaK_goiftrue(FuncState *fs,expdesc *e)

{
  expkind eVar1;
  int iVar2;
  uint *puVar3;
  uint uVar4;
  long lVar5;
  
  luaK_dischargevars(fs,e);
  eVar1 = e->k;
  iVar2 = -1;
  if ((1 < eVar1 - VK) && (eVar1 != VTRUE)) {
    if (eVar1 == VJMP) {
      lVar5 = (long)(e->u).s.info;
      puVar3 = fs->f->code + lVar5;
      if ((lVar5 < 1) || (uVar4 = puVar3[-1], (0x3df07fffffU >> ((ulong)uVar4 & 0x3f) & 1) != 0)) {
        uVar4 = *puVar3;
      }
      else {
        puVar3 = puVar3 + -1;
      }
      *puVar3 = (uint)((uVar4 & 0x3fc0) == 0) << 6 | uVar4 & 0xffffc03f;
      iVar2 = (e->u).s.info;
    }
    else {
      iVar2 = jumponcond(fs,e,0);
    }
  }
  luaK_concat(fs,&e->f,iVar2);
  iVar2 = e->t;
  fs->lasttarget = fs->pc;
  luaK_concat(fs,&fs->jpc,iVar2);
  e->t = -1;
  return;
}

Assistant:

static void luaK_goiftrue(FuncState*fs,expdesc*e){
int pc;
luaK_dischargevars(fs,e);
switch(e->k){
case VK:case VKNUM:case VTRUE:{
pc=(-1);
break;
}
case VJMP:{
invertjump(fs,e);
pc=e->u.s.info;
break;
}
default:{
pc=jumponcond(fs,e,0);
break;
}
}
luaK_concat(fs,&e->f,pc);
luaK_patchtohere(fs,e->t);
e->t=(-1);
}